

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

int rtr_bgpsec_validate_as_path(rtr_bgpsec *data,spki_table *table)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *buff;
  long in_FS_OFFSET;
  uint local_80;
  uint j;
  spki_rtvals spki_retval;
  uint8_t *curr;
  size_t len;
  uint local_60;
  uint next_offset;
  uint offset;
  int tmp_sig_len;
  rtr_signature_seg *tmp_sig;
  stream *psStack_48;
  uint stream_size;
  stream *s;
  rtr_bgpsec_rtvals retval;
  spki_table *table_local;
  rtr_bgpsec *data_local;
  spki_record *psStack_20;
  uint router_keys_len;
  spki_record *tmp_key;
  uchar *hash_result;
  
  hash_result = *(uchar **)(in_FS_OFFSET + 0x28);
  if (table == (spki_table *)0x0) {
    lrtr_dbg("BGPSEC: TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
    data_local._0_4_ = -1;
  }
  else {
    tmp_key = (spki_record *)0x0;
    psStack_20 = (spki_record *)0x0;
    psStack_48 = (stream *)0x0;
    if ((((data == (rtr_bgpsec *)0x0) || (data->path == (rtr_secure_path_seg *)0x0)) ||
        (data->sigs == (rtr_signature_seg *)0x0)) || (table == (spki_table *)0x0)) {
      data_local._0_4_ = -9;
    }
    else if ((ushort)data->path_len == data->sigs_len) {
      iVar2 = rtr_bgpsec_has_algorithm_suite(data->alg);
      if (iVar2 == -1) {
        data_local._0_4_ = -6;
      }
      else if ((data->nlri->afi == 1) || (data->nlri->afi == 2)) {
        s._4_4_ = check_router_keys(data->sigs,table);
        if (s._4_4_ == 0) {
          sVar3 = req_stream_size(data,VALIDATION);
          psStack_48 = init_stream((uint16_t)sVar3);
          s._4_4_ = align_byte_sequence(data,psStack_48,VALIDATION);
          if (s._4_4_ == 0) {
            s._4_4_ = 1;
            _offset = data->sigs;
            for (local_60 = 0; sVar3 = get_stream_size(psStack_48),
                local_60 <= sVar3 && s._4_4_ == 1; local_60 = next_offset + 0x1c + local_60) {
              if (_offset->next == (rtr_signature_seg *)0x0) {
                uVar1 = _offset->sig_len;
              }
              else {
                uVar1 = _offset->next->sig_len;
              }
              next_offset = (uint)uVar1;
              sVar3 = get_stream_size(psStack_48);
              sVar3 = sVar3 - local_60;
              buff = (uint8_t *)lrtr_malloc(sVar3);
              read_stream_at(buff,psStack_48,(uint16_t)local_60,(uint16_t)sVar3);
              s._4_4_ = hash_byte_sequence(buff,sVar3,data->alg,(uchar **)&tmp_key);
              lrtr_free(buff);
              if (s._4_4_ != 0) break;
              data_local._4_4_ = 0;
              iVar2 = spki_table_search_by_ski
                                (table,_offset->ski,&stack0xffffffffffffffe0,
                                 (uint *)((long)&data_local + 4));
              if (iVar2 == -1) {
                s._4_4_ = -1;
                break;
              }
              for (local_80 = 0; local_80 < data_local._4_4_; local_80 = local_80 + 1) {
                if (data->alg != '\x01') {
                  s._4_4_ = -6;
                  goto LAB_0011a595;
                }
                s._4_4_ = validate_signature(tmp_key->ski,_offset,psStack_20 + local_80);
                if (s._4_4_ == 1) break;
              }
              lrtr_free(tmp_key);
              lrtr_free(psStack_20);
              tmp_key = (spki_record *)0x0;
              psStack_20 = (spki_record *)0x0;
              _offset = _offset->next;
            }
          }
        }
LAB_0011a595:
        if (tmp_key != (spki_record *)0x0) {
          lrtr_free(tmp_key);
        }
        if (psStack_20 != (spki_record *)0x0) {
          lrtr_free(psStack_20);
        }
        if (psStack_48 != (stream *)0x0) {
          free_stream(psStack_48);
        }
        if (s._4_4_ == 1) {
          lrtr_dbg("BGPSEC: Validation result for the whole BGPsec_PATH: valid");
        }
        else if (s._4_4_ == 2) {
          lrtr_dbg("BGPSEC: Validation result for the whole BGPsec_PATH: invalid");
        }
        data_local._0_4_ = s._4_4_;
      }
      else {
        data_local._0_4_ = -7;
      }
    }
    else {
      data_local._0_4_ = -8;
    }
  }
  if (*(uchar **)(in_FS_OFFSET + 0x28) == hash_result) {
    return (int)data_local;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_bgpsec_validate_as_path(const struct rtr_bgpsec *data, struct spki_table *table)
{
	if (table == NULL) {
		BGPSEC_DBG1("TRYING TO VALIDATE A, BUT NO SPKI TABLE INITIALIZED");
		return RTR_BGPSEC_ERROR;
	}

	/* The AS path validation result. */
	enum rtr_bgpsec_rtvals retval = 0;

	/* The resulting hash. */
	unsigned char *hash_result = NULL;

	/* A temporare spki record */
	struct spki_record *tmp_key = NULL;

	/* A stream that holds the data that is hashed */
	struct stream *s = NULL;

	/* Total size of required space for the stream */
	unsigned int stream_size = 0;

	/* Use a temp variable in the validation loop since we don't want to
	 * alter data->sigs.
	 */
	struct rtr_signature_seg *tmp_sig = NULL;

	/* Temp variable that holds the signature length of the of the
	 * next signature segment.
	 */
	int tmp_sig_len = 0;

	/* Check, if the parameters are not NULL */
	if (!data || !data->path || !data->sigs || !table)
		return RTR_BGPSEC_INVALID_ARGUMENTS;

	/* Check, if there are as many signature segments as there are
	 * secure path segments
	 */
	if (data->path_len != data->sigs_len)
		return RTR_BGPSEC_WRONG_SEGMENT_COUNT;

	/* Check, if the algorithm suite is supported by RTRlib. */
	if (rtr_bgpsec_has_algorithm_suite(data->alg) == RTR_BGPSEC_ERROR)
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;

	/* Check, if the AFI is usable with BGPsec */
	if ((data->nlri->afi != BGPSEC_IPV4) && (data->nlri->afi != BGPSEC_IPV6))
		return RTR_BGPSEC_UNSUPPORTED_AFI;

	/* Make sure that all router keys are available. */
	retval = check_router_keys(data->sigs, table);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/* Calculate the required stream size and initialize the stream */
	stream_size = req_stream_size(data, VALIDATION);
	s = init_stream(stream_size);

	/* Align the byte sequence and store it in the stream */
	retval = align_byte_sequence(data, s, VALIDATION);

	if (retval != RTR_BGPSEC_SUCCESS)
		goto err;

	/*
	 * The validation is an iterative process. In the first iteration,
	 * the entire byte sequence is hashed to validate the first signature.
	 * In the next iteration, the process is repeated. This time, the
	 * starting position for hashing is moved by an offset to only hash
	 * the data required to validate the next signature. This procedure
	 * is repeated until all signatures are validated or a signature is
	 * determined invalid.
	 *
	 * offset: the current position from where on the bytes should
	 * be hashed.
	 *
	 * next_offset: adds to offset, after the bytes on the
	 * current offset have been processed. next_offset is not
	 * constant and must be calculated each iteration:
	 *
	 * signature length +
	 * SKI size +
	 * sizeof(var that holds signature length) +
	 * sizeof(a secure path segment)
	 *
	 *
	 *  offset
	 * |o++++++++++++++++++++++++++++++++++++++++| bytes
	 *
	 *		offset+=
	 *		new_offset
	 * |------------o++++++++++++++++++++++++++++| bytes
	 *
	 *			    offset+=
	 *			    new_offset
	 * |------------------------o++++++++++++++++| bytes
	 *
	 *
	 * A more detailed view can be found at
	 *https://mailarchive.ietf.org/arch/msg/sidr/8B_e4CNxQCUKeZ_AUzsdnn2f5Mu
	 **/

	/* Set retval to RTR_BGPSEC_VALID so the for-condition does not
	 * fail on the first for loop check.
	 */
	retval = RTR_BGPSEC_VALID;
	tmp_sig = data->sigs;

	for (unsigned int offset = 0, next_offset = 0; offset <= get_stream_size(s) && retval == RTR_BGPSEC_VALID;
	     offset += next_offset) {
		if (tmp_sig->next)
			tmp_sig_len = tmp_sig->next->sig_len;
		else
			tmp_sig_len = tmp_sig->sig_len;

		next_offset = tmp_sig_len + SKI_SIZE + sizeof(tmp_sig->sig_len) + SECURE_PATH_SEG_SIZE;

		/*
		 * From a certain position on, read until the end of the stream.
		 * The starting position is determined by the offset. The end
		 * of the stream is the total length minus the offset.
		 * The curr pointer points to the resulting "sub-stream".
		 * Hacky, could be improved.
		 */
		size_t len = get_stream_size(s) - offset;

		uint8_t *curr = lrtr_malloc(len);

		read_stream_at(curr, s, offset, len);

		retval = hash_byte_sequence(curr, len, data->alg, &hash_result);

		lrtr_free(curr);

		if (retval != RTR_BGPSEC_SUCCESS)
			goto err;

		/* Store all router keys for the given SKI in tmp_key. */
		unsigned int router_keys_len = 0;
		enum spki_rtvals spki_retval =
			spki_table_search_by_ski(table, tmp_sig->ski, &tmp_key, &router_keys_len);
		if (spki_retval == SPKI_ERROR) {
			retval = RTR_BGPSEC_ERROR;
			goto err;
		}

		/* Loop in case there are multiple router keys for one SKI. */
		for (unsigned int j = 0; j < router_keys_len; j++) {
			/* Validate the siganture depending on the algorithm
			 * suite. More if-cases are added with new algorithm
			 * suites.
			 */
			if (data->alg == RTR_BGPSEC_ALGORITHM_SUITE_1) {
				retval = validate_signature(hash_result, tmp_sig, &tmp_key[j]);
			} else {
				retval = RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
				goto err;
			}
			/* As soon as one of the router keys produces a valid
			 * result, exit the loop.
			 */
			if (retval == RTR_BGPSEC_VALID)
				break;
		}
		lrtr_free(hash_result);
		lrtr_free(tmp_key);
		hash_result = NULL;
		tmp_key = NULL;
		tmp_sig = tmp_sig->next;
	}

err:
	if (hash_result)
		lrtr_free(hash_result);
	if (tmp_key)
		lrtr_free(tmp_key);
	if (s)
		free_stream(s);

	if (retval == RTR_BGPSEC_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: valid");
	else if (retval == RTR_BGPSEC_NOT_VALID)
		BGPSEC_DBG1("Validation result for the whole BGPsec_PATH: invalid");

	return retval;
}